

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_hash.c
# Opt level: O3

_Bool ascon_hasha_matches(uint8_t *expected_digest,uint8_t *data,size_t data_len)

{
  _Bool _Var1;
  ascon_hash_ctx_t ctx;
  ascon_bufstate_t local_58;
  
  local_58.sponge.x0 = 0x1470194fc6528a6;
  local_58.sponge.x1 = 0x738ec38ac0adffa7;
  local_58.sponge.x2 = 0x2ec8e3296c76384c;
  local_58.sponge.x3 = 0xd6f6a54d7f52377d;
  local_58.sponge.x4 = 0xa13c42a223be8d87;
  local_58.buffer_len = '\0';
  local_58.flow_state = '\v';
  buffered_accumulation(&local_58,(uint8_t *)0x0,data,absorb_hasha_data,data_len,'\b');
  local_58.flow_state = '\f';
  _Var1 = hash_final_matches(ascon_permutation_8,&local_58,expected_digest,0x20);
  return _Var1;
}

Assistant:

ASCON_API bool
ascon_hasha_matches(const uint8_t expected_digest[ASCON_HASHA_DIGEST_LEN],
                    const uint8_t* const data,
                    const size_t data_len)
{
    ASCON_ASSERT(expected_digest != NULL);
    ASCON_ASSERT(data_len == 0 || data != NULL);
    ascon_hash_ctx_t ctx;
    ascon_hasha_init(&ctx);
    ascon_hasha_xof_update(&ctx, data, data_len);
    return ascon_hasha_xof_final_matches(&ctx, expected_digest, ASCON_HASHA_DIGEST_LEN);
}